

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O1

GeometryShaderInputType sglr::rr_util::mapGLGeometryShaderInputType(deUint32 primitive)

{
  GeometryShaderInputType GVar1;
  
  GVar1 = GEOMETRYSHADERINPUTTYPE_LAST;
  if (primitive < 0xe) {
    GVar1 = *(GeometryShaderInputType *)(&DAT_009ed474 + (ulong)primitive * 4);
  }
  return GVar1;
}

Assistant:

rr::GeometryShaderInputType mapGLGeometryShaderInputType (deUint32 primitive)
{
	switch (primitive)
	{
		case GL_POINTS:						return rr::GEOMETRYSHADERINPUTTYPE_POINTS;
		case GL_LINES:						return rr::GEOMETRYSHADERINPUTTYPE_LINES;
		case GL_LINE_STRIP:					return rr::GEOMETRYSHADERINPUTTYPE_LINES;
		case GL_LINE_LOOP:					return rr::GEOMETRYSHADERINPUTTYPE_LINES;
		case GL_TRIANGLES:					return rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES;
		case GL_TRIANGLE_STRIP:				return rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES;
		case GL_TRIANGLE_FAN:				return rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES;
		case GL_LINES_ADJACENCY:			return rr::GEOMETRYSHADERINPUTTYPE_LINES_ADJACENCY;
		case GL_LINE_STRIP_ADJACENCY:		return rr::GEOMETRYSHADERINPUTTYPE_LINES_ADJACENCY;
		case GL_TRIANGLES_ADJACENCY:		return rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES_ADJACENCY;
		case GL_TRIANGLE_STRIP_ADJACENCY:	return rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES_ADJACENCY;
		default:
			DE_ASSERT(DE_FALSE);
			return rr::GEOMETRYSHADERINPUTTYPE_LAST;
	}
}